

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample-sort.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Bounds<int> *this;
  ulong uVar5;
  time_t tVar6;
  size_type sVar7;
  reference pvVar8;
  reference piVar9;
  unsigned_long uVar10;
  void *pvVar11;
  FileStorage *this_00;
  size_t sVar12;
  undefined8 *in_RSI;
  size_t total;
  Proxy proxy;
  int idx;
  DiscreteBounds block_bounds;
  Link *l_1;
  ValueBlock *b_1;
  int gid_1;
  uint i_1;
  int block_size;
  BOV reader;
  ExternalStorage *in_stack_00000580;
  vector<int,_std::allocator<int>_> shape;
  size_t sz;
  file in;
  Link *l;
  ValueBlock *b;
  int gid;
  uint i;
  vector<int,_std::allocator<int>_> gids;
  ContiguousAssigner assigner;
  Master master;
  FileStorage storage;
  string infile;
  Value max;
  Value min;
  bool help;
  bool verify;
  bool verbose;
  bool print;
  string prefix;
  int chunk_size;
  int threads;
  int mem_blocks;
  int num_samples;
  int k;
  size_t num_values;
  int nblocks;
  Options ops;
  communicator world;
  environment env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdcc8;
  value_type_conflict *__x;
  Master *in_stack_ffffffffffffdcd0;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffdcd8;
  NeverSkip *__f;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffdce0;
  string *in_stack_ffffffffffffdce8;
  Block<float> *in_stack_ffffffffffffdcf0;
  string *in_stack_ffffffffffffdcf8;
  Master *in_stack_ffffffffffffdd00;
  anon_class_4_1_eba87654 *in_stack_ffffffffffffdd08;
  undefined4 in_stack_ffffffffffffdd10;
  undefined4 in_stack_ffffffffffffdd14;
  Options *in_stack_ffffffffffffdd18;
  FileStorage *in_stack_ffffffffffffdd20;
  undefined4 in_stack_ffffffffffffdd28;
  undefined4 in_stack_ffffffffffffdd2c;
  BOV *in_stack_ffffffffffffdd30;
  string *in_stack_ffffffffffffdd38;
  undefined4 in_stack_ffffffffffffdd40;
  undefined4 in_stack_ffffffffffffdd44;
  undefined8 in_stack_ffffffffffffdd48;
  Master *in_stack_ffffffffffffdd50;
  undefined4 in_stack_ffffffffffffdd58;
  undefined4 in_stack_ffffffffffffdd5c;
  file *in_stack_ffffffffffffdd60;
  undefined4 in_stack_ffffffffffffdd88;
  Master *this_01;
  MemoryManagement *in_stack_ffffffffffffddb0;
  undefined4 in_stack_ffffffffffffddbc;
  undefined1 remote;
  int in_stack_ffffffffffffddc0;
  int in_stack_ffffffffffffddc4;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  code *local_1f00;
  _Manager_type local_1ef8;
  byte local_1ec2;
  undefined4 local_1e9c;
  char **in_stack_ffffffffffffe190;
  int in_stack_ffffffffffffe19c;
  Options *in_stack_ffffffffffffe1a0;
  _Rb_tree_color local_1e00;
  uint local_1d5c;
  vector<int,_std::allocator<int>_> local_1d58;
  code *local_1d30;
  NeverSkip local_1d28 [32];
  code *local_1d08;
  undefined1 local_1d00 [72];
  code *local_1cb8;
  communicator local_1c90 [237];
  value_type_conflict local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5c8;
  string local_5c0 [32];
  int local_5a0;
  allocator<char> local_599;
  string local_598 [39];
  allocator<char> local_571;
  string local_570 [47];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [47];
  allocator<char> local_4e9;
  string local_4e8 [39];
  allocator<char> local_4c1;
  string local_4c0 [47];
  allocator<char> local_491;
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [47];
  allocator<char> local_439;
  string local_438 [39];
  allocator<char> local_411;
  string local_410 [47];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [47];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [47];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [47];
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [47];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [44];
  undefined4 local_22c;
  undefined4 local_228;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [47];
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [47];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [47];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [43];
  byte local_c5;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0 [36];
  int local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  long local_88;
  int local_7c;
  communicator local_30;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffdcd0,
             (int)((ulong)in_stack_ffffffffffffdcc8 >> 0x20),(char **)0x1111bd);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffdcd0);
  opts::Options::Options((Options *)in_stack_ffffffffffffdcd0);
  local_7c = diy::mpi::communicator::size(&local_30);
  local_88 = 100;
  local_8c = 2;
  local_90 = 8;
  local_94 = 0xffffffff;
  local_98 = 1;
  local_9c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<bool>(in_stack_ffffffffffffdcf8,(bool *)in_stack_ffffffffffffdcf0,
                     in_stack_ffffffffffffdce8);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<bool>((char)((ulong)in_stack_ffffffffffffdd08 >> 0x38),
                     (string *)in_stack_ffffffffffffdd00,(bool *)in_stack_ffffffffffffdcf8,
                     (string *)in_stack_ffffffffffffdcf0);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<bool>(in_stack_ffffffffffffdcf8,(bool *)in_stack_ffffffffffffdcf0,
                     in_stack_ffffffffffffdce8);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<bool>((char)((ulong)in_stack_ffffffffffffdd08 >> 0x38),
                     (string *)in_stack_ffffffffffffdd00,(bool *)in_stack_ffffffffffffdcf8,
                     (string *)in_stack_ffffffffffffdcf0);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_228 = 0;
  local_22c = 0x49800000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<unsigned_long>
            ((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
             (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
             (unsigned_long *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
                    (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                    (int *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
                    (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                    (int *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
                    (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                    (int *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
                    (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                    (int *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
                    (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                    (int *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffdd48 >> 0x38),
                    (string *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                    (int *)in_stack_ffffffffffffdd38,(string *)in_stack_ffffffffffffdd30);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<std::__cxx11::string>
            (in_stack_ffffffffffffdd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdd30,
             (string *)CONCAT44(in_stack_ffffffffffffdd2c,in_stack_ffffffffffffdd28));
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<float>(in_stack_ffffffffffffdd38,(float *)in_stack_ffffffffffffdd30,
                      (string *)CONCAT44(in_stack_ffffffffffffdd2c,in_stack_ffffffffffffdd28));
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
             (char *)in_stack_ffffffffffffdd08,(allocator<char> *)in_stack_ffffffffffffdd00);
  opts::Option<float>(in_stack_ffffffffffffdd38,(float *)in_stack_ffffffffffffdd30,
                      (string *)CONCAT44(in_stack_ffffffffffffdd2c,in_stack_ffffffffffffdd28));
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcc8);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffdcd0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  bVar1 = opts::Options::parse
                    (in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,in_stack_ffffffffffffe190);
  if ((!bVar1) || ((local_c5 & 1) != 0)) {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar4 = std::operator<<(poVar4,(char *)*local_10);
      std::operator<<(poVar4," [OPTIONS] [INPUT.bov]\n");
      std::operator<<((ostream *)&std::cout,
                      "Generates random values in range [min,max] if not INPUT.bov is given.\n");
      opts::operator<<((ostream *)in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
    }
    local_4 = 1;
    local_5a0 = 1;
    goto LAB_00113a4f;
  }
  std::__cxx11::string::string(local_5c0);
  local_5c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              opts::PosOption<std::__cxx11::string>(in_stack_ffffffffffffdcc8);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffdcd0,
             (PosOptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffdcc8);
  diy::FileStorage::FileStorage(in_stack_ffffffffffffdd20,(string *)in_stack_ffffffffffffdd18);
  diy::mpi::communicator::communicator(local_1c90,&local_30);
  local_1cb8 = Block<float>::create;
  std::function<void*()>::function<void*(*)(),void>
            ((function<void_*()> *)in_stack_ffffffffffffdce0,
             (_func_void_ptr **)in_stack_ffffffffffffdcd8);
  local_1d00._32_8_ = Block<float>::destroy;
  std::function<void(void*)>::function<void(*)(void*),void>
            ((function<void_(void_*)> *)in_stack_ffffffffffffdce0,
             (_func_void_void_ptr **)in_stack_ffffffffffffdcd8);
  local_1d08 = Block<float>::save;
  std::function<void(void_const*,diy::BinaryBuffer&)>::
  function<void(*)(void_const*,diy::BinaryBuffer&),void>
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffdce0,
             in_stack_ffffffffffffdcd8);
  local_1d30 = Block<float>::load;
  std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
            (in_stack_ffffffffffffdce0,in_stack_ffffffffffffdcd8);
  this = (Bounds<int> *)operator_new(0x10);
  diy::Master::QueueSizePolicy::QueueSizePolicy
            ((QueueSizePolicy *)in_stack_ffffffffffffdcd0,(size_t)in_stack_ffffffffffffdcc8);
  __f = local_1d28;
  in_stack_ffffffffffffdcd0 = (Master *)local_1d00;
  __x = local_648;
  diy::Master::Master((Master *)
                      reader.stride_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (communicator *)
                      reader.stride_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      reader.stride_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      (int)reader.stride_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                      (CreateBlock *)
                      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (DestroyBlock *)
                      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,in_stack_00000580,
                      (SaveBlock *)
                      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (LoadBlock *)
                      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      (QueuePolicy *)
                      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x112be7);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x112bf4);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x112c01);
  std::function<void_*()>::~function((function<void_*()> *)0x112c0e);
  diy::mpi::communicator::~communicator((communicator *)0x112c1b);
  diy::mpi::communicator::size(&local_30);
  diy::ContiguousAssigner::Assigner
            ((ContiguousAssigner *)in_stack_ffffffffffffdcd0,(int)((ulong)__x >> 0x20),(int)__x);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x112c5b);
  diy::mpi::communicator::rank(&local_30);
  diy::ContiguousAssigner::local_gids
            ((ContiguousAssigner *)in_stack_ffffffffffffdd00,
             (int)((ulong)in_stack_ffffffffffffdcf8 >> 0x20),
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdcf0);
  uVar5 = std::__cxx11::string::empty();
  iVar2 = local_7c;
  remote = (undefined1)((uint)in_stack_ffffffffffffddbc >> 0x18);
  if ((uVar5 & 1) == 0) {
    iVar3 = diy::mpi::communicator::size(&local_30);
    if (iVar2 % iVar3 == 0) {
      diy::mpi::io::file::file
                (in_stack_ffffffffffffdd60,
                 (communicator *)CONCAT44(in_stack_ffffffffffffdd5c,in_stack_ffffffffffffdd58),
                 (string *)in_stack_ffffffffffffdd50,(int)((ulong)in_stack_ffffffffffffdd48 >> 0x20)
                );
      uVar5 = diy::mpi::io::file::size((file *)in_stack_ffffffffffffdcd0);
      uVar5 = uVar5 >> 2;
      if (uVar5 % (ulong)(long)(local_9c * local_7c) == 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1130af);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdcd0,__x);
        diy::io::BOV::BOV<std::vector<int,std::allocator<int>>>
                  ((BOV *)in_stack_ffffffffffffdd00,(file *)in_stack_ffffffffffffdcf8,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdcf0,
                   (offset)in_stack_ffffffffffffdce8);
        iVar2 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                     (long)local_7c);
        for (local_1e00 = _S_red; sVar7 = std::vector<int,_std::allocator<int>_>::size(&local_1d58),
            local_1e00 < sVar7; local_1e00 = local_1e00 + _S_black) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_1d58,(ulong)local_1e00)
          ;
          in_stack_ffffffffffffddc0 = *pvVar8;
          pvVar11 = operator_new(0x40);
          Block<float>::Block((Block<float> *)in_stack_ffffffffffffdcd0,(int)((ulong)__x >> 0x20));
          operator_new(0x20);
          diy::Link::Link((Link *)in_stack_ffffffffffffdcd0);
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffdcf0,
                     (size_type)in_stack_ffffffffffffdce8);
          diy::Bounds<int>::Bounds(this,(int)((ulong)__f >> 0x20));
          iVar3 = iVar2 / local_9c;
          piVar9 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                             ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                              in_stack_ffffffffffffdcd0,(size_type)__x);
          *piVar9 = in_stack_ffffffffffffddc0 * iVar3;
          in_stack_ffffffffffffddc0 = in_stack_ffffffffffffddc0 + 1;
          in_stack_ffffffffffffddc4 = in_stack_ffffffffffffddc0 * (iVar2 / local_9c) + -1;
          piVar9 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                             ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                              in_stack_ffffffffffffdcd0,(size_type)__x);
          *piVar9 = in_stack_ffffffffffffddc4;
          std::vector<float,_std::allocator<float>_>::operator[]
                    ((vector<float,_std::allocator<float>_> *)((long)pvVar11 + 8),0);
          diy::io::BOV::read<float>
                    (in_stack_ffffffffffffdd30,
                     (DiscreteBounds *)CONCAT44(in_stack_ffffffffffffdd2c,in_stack_ffffffffffffdd28)
                     ,(float *)in_stack_ffffffffffffdd20,
                     SUB81((ulong)in_stack_ffffffffffffdd18 >> 0x38,0),
                     (int)in_stack_ffffffffffffdd18);
          diy::Master::add(in_stack_ffffffffffffdd50,(int)((ulong)in_stack_ffffffffffffdd48 >> 0x20)
                           ,(void *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                           (Link *)in_stack_ffffffffffffdd38);
          diy::Bounds<int>::~Bounds((Bounds<int> *)in_stack_ffffffffffffdcd0);
        }
        iVar2 = diy::mpi::communicator::rank(&local_30);
        if (iVar2 == 0) {
          in_stack_ffffffffffffddb0 =
               (MemoryManagement *)std::operator<<((ostream *)&std::cout,"Array loaded");
          std::ostream::operator<<(in_stack_ffffffffffffddb0,std::endl<char,std::char_traits<char>>)
          ;
        }
        remote = (undefined1)((uint)iVar2 >> 0x18);
        diy::io::BOV::~BOV((BOV *)in_stack_ffffffffffffdcd0);
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
        local_5a0 = 0;
      }
      else {
        iVar2 = diy::mpi::communicator::rank(&local_30);
        if (iVar2 == 0) {
          fmt::v7::print<char[70],,char>
                    ((FILE *)in_stack_ffffffffffffdd18,
                     (char (*) [70])CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10));
        }
        local_4 = 1;
        local_5a0 = 1;
      }
      diy::mpi::io::file::~file((file *)in_stack_ffffffffffffdcd0);
      if (local_5a0 == 0) goto LAB_001134a0;
    }
    else {
      iVar2 = diy::mpi::communicator::rank(&local_30);
      if (iVar2 == 0) {
        fmt::v7::print<char[87],,char>
                  ((FILE *)in_stack_ffffffffffffdd18,
                   (char (*) [87])CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10));
      }
      local_4 = 1;
      local_5a0 = 1;
    }
  }
  else {
    tVar6 = time((time_t *)0x0);
    srand((uint)tVar6);
    local_1d5c = 0;
    while( true ) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&local_1d58);
      remote = (undefined1)((uint)in_stack_ffffffffffffddbc >> 0x18);
      if (sVar7 <= local_1d5c) break;
      std::vector<int,_std::allocator<int>_>::operator[](&local_1d58,(ulong)local_1d5c);
      operator_new(0x40);
      Block<float>::Block((Block<float> *)in_stack_ffffffffffffdcd0,(int)((ulong)__x >> 0x20));
      operator_new(0x20);
      diy::Link::Link((Link *)in_stack_ffffffffffffdcd0);
      Block<float>::generate_values
                (in_stack_ffffffffffffdcf0,(size_t)in_stack_ffffffffffffdce8,
                 (float)((ulong)this >> 0x20),SUB84(this,0));
      diy::Master::add(in_stack_ffffffffffffdd50,(int)((ulong)in_stack_ffffffffffffdd48 >> 0x20),
                       (void *)CONCAT44(in_stack_ffffffffffffdd44,in_stack_ffffffffffffdd40),
                       (Link *)in_stack_ffffffffffffdd38);
      local_1d5c = local_1d5c + 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Blocks generated");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
LAB_001134a0:
    diy::sort<Block<float>,float>
              (in_stack_ffffffffffffdd00,(Assigner *)in_stack_ffffffffffffdcf8,
               (ValuesVector)in_stack_ffffffffffffdcf0,(ValuesVector)in_stack_ffffffffffffdce8,
               (size_t)this,(int)((ulong)__f >> 0x20));
    if (((local_c2 & 1) != 0) || ((local_c4 & 1) != 0)) {
      local_1e9c = local_7c;
      std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
                ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
      diy::Master::foreach<main::__0>
                ((Master *)CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
                 in_stack_ffffffffffffdd08,(Skip *)in_stack_ffffffffffffdd00);
      std::function<bool_(int,_const_diy::Master_&)>::~function
                ((function<bool_(int,_const_diy::Master_&)> *)0x11353c);
    }
    if ((local_c2 & 1) != 0) {
      fmt::v7::print<char[17],,char>((char (*) [17])in_stack_ffffffffffffdcf8);
      local_1ec2 = local_c3 & 1;
      std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
                ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
      diy::Master::foreach<main::__1>
                ((Master *)CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
                 (anon_class_1_1_9847ac62 *)in_stack_ffffffffffffdd08,
                 (Skip *)in_stack_ffffffffffffdd00);
      std::function<bool_(int,_const_diy::Master_&)>::~function
                ((function<bool_(int,_const_diy::Master_&)> *)0x1135d9);
    }
    if ((local_c4 & 1) != 0) {
      fmt::v7::print<char[18],,char>((char (*) [18])in_stack_ffffffffffffdcf8);
      local_1f00 = Block<float>::verify_block;
      local_1ef8 = (_Manager_type)0x0;
      this_01 = (Master *)&stack0xffffffffffffe0e0;
      std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
                ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
      diy::Master::foreach<void(Block<float>::*)(diy::Master::ProxyWithLink_const&)>
                ((Master *)CONCAT44(in_stack_ffffffffffffdd14,in_stack_ffffffffffffdd10),
                 (offset_in_Block<float>_to_subr *)in_stack_ffffffffffffdd08,
                 (Skip *)in_stack_ffffffffffffdd00);
      std::function<bool_(int,_const_diy::Master_&)>::~function
                ((function<bool_(int,_const_diy::Master_&)> *)0x113681);
      local_1f38 = 0;
      uStack_1f30 = 0;
      local_1f48 = 0;
      uStack_1f40 = 0;
      local_1f58 = 0;
      uStack_1f50 = 0;
      local_1f68 = 0;
      uStack_1f60 = 0;
      local_1f78 = 0;
      uStack_1f70 = 0;
      local_1f88 = 0;
      uStack_1f80 = 0;
      iVar2 = (int)((ulong)&local_1f88 >> 0x20);
      diy::MemoryManagement::MemoryManagement((MemoryManagement *)in_stack_ffffffffffffdcd0);
      diy::Master::exchange
                ((Master *)CONCAT44(in_stack_ffffffffffffddc4,in_stack_ffffffffffffddc0),
                 (bool)remote,in_stack_ffffffffffffddb0);
      diy::MemoryManagement::~MemoryManagement((MemoryManagement *)in_stack_ffffffffffffdcd0);
      iVar3 = diy::Master::loaded_block((Master *)0x1136fc);
      diy::Master::proxy(this_01,iVar2,(IExchangeInfo *)CONCAT44(iVar3,in_stack_ffffffffffffdd88));
      uVar10 = diy::Master::Proxy::get<unsigned_long>((Proxy *)in_stack_ffffffffffffdcd0);
      poVar4 = std::operator<<((ostream *)&std::cout,"Total values: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar10);
      poVar4 = std::operator<<(poVar4," vs ");
      pvVar11 = (void *)std::ostream::operator<<(poVar4,local_7c * local_88);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      iVar2 = diy::mpi::communicator::rank(&local_30);
      if (iVar2 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Blocks verified");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      diy::Master::ProxyWithLink::~ProxyWithLink((ProxyWithLink *)0x1138d1);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"[");
    iVar2 = diy::mpi::communicator::rank(&local_30);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,"] Storage count:    ");
    iVar2 = diy::FileStorage::count((FileStorage *)in_stack_ffffffffffffdd00);
    in_stack_ffffffffffffdd20 = (FileStorage *)std::ostream::operator<<(poVar4,iVar2);
    std::ostream::operator<<(in_stack_ffffffffffffdd20,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[");
    iVar2 = diy::mpi::communicator::rank(&local_30);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    this_00 = (FileStorage *)std::operator<<(poVar4,"] Storage max size: ");
    sVar12 = diy::FileStorage::max_size(this_00);
    pvVar11 = (void *)std::ostream::operator<<(this_00,sVar12);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    local_5a0 = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x113a28);
  diy::Master::~Master(in_stack_ffffffffffffdcd0);
  diy::FileStorage::~FileStorage(in_stack_ffffffffffffdd20);
  std::__cxx11::string::~string(local_5c0);
LAB_00113a4f:
  std::__cxx11::string::~string(local_c0);
  opts::Options::~Options((Options *)in_stack_ffffffffffffdcd0);
  diy::mpi::communicator::~communicator((communicator *)0x113a76);
  diy::mpi::environment::~environment((environment *)0x113a83);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  using namespace opts;
  Options ops;

  int               nblocks     = world.size();
  size_t            num_values  = 100;
  int               k           = 2;
  int               num_samples = 8;
  int               mem_blocks  = -1;
  int               threads     = 1;
  int               chunk_size  = 1;
  std::string       prefix      = "./DIY.XXXXXX";

  bool print, verbose, verify, help;
  ops
      >> Option(     "print",   print,      "print the result")
      >> Option('v', "verbose", verbose,    "verbose output")
      >> Option(     "verify",  verify,     "verify the result")
      >> Option('h', "help",    help,       "show help")
  ;

  Value             min = 0,
                    max = 1 << 20;

  ops
      >> Option('n', "number",  num_values,     "number of values per block")
      >> Option('k', "k",       k,              "use k-ary swap")
      >> Option('s', "samples", num_samples,    "number of samples per block")
      >> Option('b', "blocks",  nblocks,        "number of blocks")
      >> Option('t', "thread",  threads,        "number of threads")
      >> Option('m', "memory",  mem_blocks,     "number of blocks to keep in memory")
      >> Option('c', "chunk",   chunk_size,     "size of a chunk in which to read the data")
      >> Option(     "prefix",  prefix,         "prefix for external storage")
  ;

  ops
      >> Option(     "min",     min,            "range min")
      >> Option(     "max",     max,            "range max")
  ;

  if (!ops.parse(argc,argv) || help)
  {
      if (world.rank() == 0)
      {
          std::cout << "Usage: " << argv[0] << " [OPTIONS] [INPUT.bov]\n";
          std::cout << "Generates random values in range [min,max] if not INPUT.bov is given.\n";
          std::cout << ops;
      }
      return 1;
  }

  std::string infile;
  ops >> PosOption(infile);

  diy::FileStorage          storage(prefix);
  diy::Master               master(world,
                                   threads,
                                   mem_blocks,
                                   &ValueBlock::create,
                                   &ValueBlock::destroy,
                                   &storage,
                                   &ValueBlock::save,
                                   &ValueBlock::load);

  diy::ContiguousAssigner   assigner(world.size(), nblocks);
  //diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  std::vector<int> gids;
  assigner.local_gids(world.rank(), gids);

  if (infile.empty())
  {
    srand(static_cast<unsigned int>(time(0)));

    for (unsigned i = 0; i < gids.size(); ++i)
    {
      int             gid = gids[i];
      ValueBlock*     b   = new ValueBlock(0);      // bins not used in sample-sort
      Link*           l   = new Link;

      // this could be replaced by reading values from a file
      b->generate_values(num_values, min, max);

      master.add(gid, b, l);
    }
    std::cout << "Blocks generated" << std::endl;
  } else
  {
    if (nblocks % world.size() != 0)
    {
      if (world.rank() == 0)
          fmt::print(stderr, "Number of blocks must be divisible by the number of processes (for collective MPI-IO)\n");
      return 1;
    }

    // determine the size of the file, divide by sizeof(Value)
    diy::mpi::io::file in(world, infile, diy::mpi::io::file::rdonly);
    size_t sz = in.size() / sizeof(Value);

    // We have to work around a weirdness in MPI-IO. MPI expresses various
    // sizes as integers, which is too small to reference large data. So
    // instead we create a FileBlock of larger size and read in terms of those
    // blocks.
    if (sz % (chunk_size * nblocks) != 0)
    {
      if (world.rank() == 0)
          fmt::print(stderr, "Expected data size to align with the number of blocks and chunk size\n");
      return 1;
    }

    std::vector<int> shape;
    shape.push_back(static_cast<int>(sz / chunk_size));
    diy::io::BOV reader(in, shape);

    int block_size = static_cast<int>(sz) / nblocks;

    for (unsigned i = 0; i < gids.size(); ++i)
    {
      int             gid = gids[i];
      ValueBlock*     b   = new ValueBlock(num_samples);
      Link*           l   = new Link;

      // read values from a file
      b->values.resize(static_cast<size_t>(block_size));
      diy::DiscreteBounds block_bounds(1);
      block_bounds.min[0] =  gid      * (block_size / chunk_size);
      block_bounds.max[0] = (gid + 1) * (block_size / chunk_size) - 1;

      reader.read(block_bounds, &b->values[0], true, chunk_size);

      master.add(gid, b, l);
    }

    if (world.rank() == 0)
      std::cout << "Array loaded" << std::endl;
  }

  diy::sort(master, assigner,
            &ValueBlock::values,
            &ValueBlock::samples,
            num_samples,
            k);

  if (print || verify)
    master.foreach([nblocks](ValueBlock* b, const diy::Master::ProxyWithLink& cp) { set_min_max(b, cp, nblocks); });

  if (print)
  {
    fmt::print("Printing blocks\n");
    master.foreach([verbose](ValueBlock* b, const diy::Master::ProxyWithLink& cp) { b->print_block(cp, verbose); });
  }
  if (verify)
  {
    fmt::print("Verifying blocks\n");
    master.foreach(&ValueBlock::verify_block);

    master.exchange();      // to process collectives
    typedef diy::Master::ProxyWithLink      Proxy;
    int     idx   = master.loaded_block();
    Proxy   proxy = master.proxy(idx);
    size_t  total = proxy.get<size_t>();
    std::cout << "Total values: " << total << " vs " << nblocks * num_values << std::endl;

    if (world.rank() == 0)
      std::cout << "Blocks verified" << std::endl;
  }

  std::cout << "[" << world.rank() << "] Storage count:    " << storage.count() << std::endl;
  std::cout << "[" << world.rank() << "] Storage max size: " << storage.max_size() << std::endl;
}